

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(cmLocalNinjaGenerator *this,ostream *os)

{
  cmGlobalNinjaGenerator *this_00;
  string rulesFilePath;
  string ninjaRulesFile;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::operator<<(os,"# Include auxiliary files.\n\n");
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,cmGlobalNinjaGenerator::NINJA_RULES_FILE,
             (allocator<char> *)&local_50);
  cmGlobalNinjaGenerator::NinjaOutputPath(&local_30,this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cmGlobalNinjaGenerator::EncodePath(&local_70,this_00,&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Include rules file.",&local_71);
  cmGlobalNinjaGenerator::WriteInclude(os,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<(os,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Include auxiliary files.\n\n";
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string const ninjaRulesFile =
    ng->NinjaOutputPath(cmGlobalNinjaGenerator::NINJA_RULES_FILE);
  std::string const rulesFilePath = ng->EncodePath(ninjaRulesFile);
  cmGlobalNinjaGenerator::WriteInclude(os, rulesFilePath,
                                       "Include rules file.");
  os << "\n";
}